

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O3

vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots
          (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           *__return_storage_ptr__,
          vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *blocks,
          get_blocks_func *succ_func,get_blocks_func *pred_func)

{
  pointer *pppBVar1;
  pointer ppBVar2;
  _Hash_node_base *p_Var3;
  BasicBlock *pBVar4;
  iterator iVar5;
  _Manager_type p_Var6;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar7;
  pointer ppBVar8;
  BasicBlock *block;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  BasicBlock *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *local_70;
  _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppBVar8 = (blocks->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (blocks->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar8 != ppBVar2) {
    local_70 = blocks;
    do {
      local_100 = *ppBVar8;
      local_b8._M_unused._0_8_ = (undefined8)local_100;
      if ((pred_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      pvVar7 = (*pred_func->_M_invoker)((_Any_data *)pred_func,(BasicBlock **)&local_b8);
      if ((pvVar7->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (pvVar7->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        if (local_68._M_buckets[(ulong)local_100 % local_68._M_bucket_count] != (__node_base_ptr)0x0
           ) {
          p_Var3 = local_68._M_buckets[(ulong)local_100 % local_68._M_bucket_count]->_M_nxt;
          pBVar4 = (BasicBlock *)p_Var3[1]._M_nxt;
          do {
            if (local_100 == pBVar4) {
              __assert_fail("visited.count(block) == 0 && \"Malformed graph!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                            ,0x14a,
                            "static std::vector<BB *> spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots(const std::vector<BB *> &, get_blocks_func, get_blocks_func) [BB = spvtools::val::BasicBlock]"
                           );
            }
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (pBVar4 = (BasicBlock *)p_Var3[1]._M_nxt,
                  (ulong)pBVar4 % local_68._M_bucket_count ==
                  (ulong)local_100 % local_68._M_bucket_count));
        }
        iVar5._M_current =
             (__return_storage_ptr__->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
          _M_realloc_insert<spvtools::val::BasicBlock*const&>
                    ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>
                      *)__return_storage_ptr__,iVar5,&local_100);
        }
        else {
          *iVar5._M_current = local_100;
          pppBVar1 = &(__return_storage_ptr__->
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
        pBVar4 = local_100;
        local_b8._M_unused._M_object = (BasicBlock *)0x0;
        local_b8._8_8_ = 0;
        local_a8 = (_Manager_type)0x0;
        p_Stack_a0 = (_Invoker_type)0x0;
        p_Var6 = (succ_func->super__Function_base)._M_manager;
        if (p_Var6 != (_Manager_type)0x0) {
          (*p_Var6)(&local_b8,(_Any_data *)succ_func,__clone_functor);
          local_a8 = (succ_func->super__Function_base)._M_manager;
          p_Stack_a0 = succ_func->_M_invoker;
        }
        local_f8._8_8_ = 0;
        local_f8._M_unused._M_object = &local_68;
        local_e0 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:315:23)>
                   ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:315:23)>
                   ::_M_manager;
        local_d8._M_unused._M_object = (void *)0x0;
        local_d8._8_8_ = 0;
        local_c0 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:316:23)>
                   ::_M_invoke;
        local_c8 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:316:23)>
                   ::_M_manager;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_80 = std::
                   _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:317:29)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:317:29)>
                   ::_M_manager;
        DepthFirstTraversal(pBVar4,(get_blocks_func *)&local_b8,
                            (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_f8,
                            (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_d8,
                            (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,__destroy_functor);
        }
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        if (local_a8 != (_Manager_type)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
      }
      ppBVar8 = ppBVar8 + 1;
    } while (ppBVar8 != ppBVar2);
    ppBVar8 = (local_70->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppBVar2 = (local_70->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar8 != ppBVar2) {
      do {
        local_100 = *ppBVar8;
        if (local_68._M_buckets[(ulong)local_100 % local_68._M_bucket_count] != (__node_base_ptr)0x0
           ) {
          p_Var3 = local_68._M_buckets[(ulong)local_100 % local_68._M_bucket_count]->_M_nxt;
          pBVar4 = (BasicBlock *)p_Var3[1]._M_nxt;
          do {
            if (local_100 == pBVar4) goto LAB_002045e4;
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (pBVar4 = (BasicBlock *)p_Var3[1]._M_nxt,
                  (ulong)pBVar4 % local_68._M_bucket_count ==
                  (ulong)local_100 % local_68._M_bucket_count));
        }
        iVar5._M_current =
             (__return_storage_ptr__->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
          _M_realloc_insert<spvtools::val::BasicBlock*const&>
                    ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>
                      *)__return_storage_ptr__,iVar5,&local_100);
        }
        else {
          *iVar5._M_current = local_100;
          pppBVar1 = &(__return_storage_ptr__->
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
        pBVar4 = local_100;
        local_b8._M_unused._M_object = (BasicBlock *)0x0;
        local_b8._8_8_ = 0;
        local_a8 = (_Manager_type)0x0;
        p_Stack_a0 = (_Invoker_type)0x0;
        p_Var6 = (succ_func->super__Function_base)._M_manager;
        if (p_Var6 != (_Manager_type)0x0) {
          (*p_Var6)(&local_b8,(_Any_data *)succ_func,__clone_functor);
          local_a8 = (succ_func->super__Function_base)._M_manager;
          p_Stack_a0 = succ_func->_M_invoker;
        }
        local_f8._8_8_ = 0;
        local_f8._M_unused._M_object = &local_68;
        local_e0 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:315:23)>
                   ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:315:23)>
                   ::_M_manager;
        local_d8._M_unused._M_object = (void *)0x0;
        local_d8._8_8_ = 0;
        local_c0 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:316:23)>
                   ::_M_invoke;
        local_c8 = std::
                   _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:316:23)>
                   ::_M_manager;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_80 = std::
                   _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:317:29)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h:317:29)>
                   ::_M_manager;
        DepthFirstTraversal(pBVar4,(get_blocks_func *)&local_b8,
                            (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_f8,
                            (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_d8,
                            (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,__destroy_functor);
        }
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        if (local_a8 != (_Manager_type)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
LAB_002045e4:
        ppBVar8 = ppBVar8 + 1;
      } while (ppBVar8 != ppBVar2);
    }
  }
  std::
  _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BB*> CFA<BB>::TraversalRoots(const std::vector<BB*>& blocks,
                                         get_blocks_func succ_func,
                                         get_blocks_func pred_func) {
  // The set of nodes which have been visited from any of the roots so far.
  std::unordered_set<const BB*> visited;

  auto mark_visited = [&visited](const BB* b) { visited.insert(b); };
  auto ignore_block = [](const BB*) {};
  auto no_terminal_blocks = [](const BB*) { return false; };

  auto traverse_from_root = [&mark_visited, &succ_func, &ignore_block,
                             &no_terminal_blocks](const BB* entry) {
    DepthFirstTraversal(entry, succ_func, mark_visited, ignore_block,
                        no_terminal_blocks);
  };

  std::vector<BB*> result;

  // First collect nodes without predecessors.
  for (auto block : blocks) {
    if (pred_func(block)->empty()) {
      assert(visited.count(block) == 0 && "Malformed graph!");
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  // Now collect other stranded nodes.  These must be in unreachable cycles.
  for (auto block : blocks) {
    if (visited.count(block) == 0) {
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  return result;
}